

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

SimpleString __thiscall SimpleString::lowerCase(SimpleString *this)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  size_t n;
  size_t sVar4;
  size_t extraout_RDX;
  size_t sVar5;
  undefined8 *in_RSI;
  char cVar6;
  SimpleString SVar7;
  
  this->buffer_ = (char *)0x0;
  this->bufferSize_ = 0;
  copyBufferToNewInternalBuffer(this,(char *)*in_RSI);
  pcVar2 = this->buffer_;
  sVar4 = 0xffffffffffffffff;
  do {
    lVar3 = sVar4 + 1;
    sVar4 = sVar4 + 1;
  } while (pcVar2[lVar3] != '\0');
  sVar5 = extraout_RDX;
  if (sVar4 != 0) {
    sVar5 = 0;
    do {
      cVar1 = pcVar2[sVar5];
      cVar6 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar6 = cVar1;
      }
      pcVar2[sVar5] = cVar6;
      sVar5 = sVar5 + 1;
    } while (sVar4 != sVar5);
  }
  SVar7.bufferSize_ = sVar5;
  SVar7.buffer_ = (char *)this;
  return SVar7;
}

Assistant:

SimpleString SimpleString::lowerCase() const
{
    SimpleString str(*this);

    size_t str_size = str.size();
    for (size_t i = 0; i < str_size; i++)
        str.buffer_[i] = ToLower(str.getBuffer()[i]);

    return str;
}